

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf_common.cpp
# Opt level: O2

double SqrSum(vector<double,_std::allocator<double>_> *arr)

{
  double dVar1;
  pointer pdVar2;
  int i;
  long lVar3;
  double dVar4;
  
  pdVar2 = (arr->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar4 = 0.0;
  for (lVar3 = 0;
      (long)(arr->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 != lVar3; lVar3 = lVar3 + 1) {
    dVar1 = pdVar2[lVar3];
    dVar4 = dVar4 + dVar1 * dVar1;
  }
  return dVar4;
}

Assistant:

double SqrSum(const vector<double> &arr) {
    double s = 0;
    for (int i = 0; i < arr.size(); i++)
            s+=sqr(arr[i]);
    return s;
}